

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

char * same_path(char *pixname,char *hdrname)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  char *newpixname;
  int len;
  int local_1c;
  char *local_8;
  
  local_8 = (char *)calloc(0x1ff,1);
  if (local_8 == (char *)0x0) {
    ffpmsg((char *)0x2082a6);
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = strncmp(in_RDI,"HDR$",4);
    if (iVar1 == 0) {
      strncpy(local_8,in_RSI,0xff);
      sVar2 = strlen(local_8);
      local_1c = (int)sVar2;
      while( true ) {
        bVar4 = false;
        if (0 < local_1c) {
          bVar4 = local_8[local_1c + -1] != '/';
        }
        if (!bVar4) break;
        local_1c = local_1c + -1;
      }
      local_8[local_1c] = '\0';
      strncat(local_8,in_RDI + 4,0xff);
    }
    else {
      pcVar3 = strchr(in_RDI,0x2f);
      if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(in_RDI,0x24), pcVar3 == (char *)0x0)) {
        strncpy(local_8,in_RSI,0xff);
        sVar2 = strlen(local_8);
        local_1c = (int)sVar2;
        while( true ) {
          bVar4 = false;
          if (0 < local_1c) {
            bVar4 = local_8[local_1c + -1] != '/';
          }
          if (!bVar4) break;
          local_1c = local_1c + -1;
        }
        local_8[local_1c] = '\0';
        strncat(local_8,in_RDI,0xff);
      }
      else {
        iVar1 = strncmp(in_RDI,"HDR",3);
        if (iVar1 == 0) {
          strncpy(local_8,in_RSI,0xff);
          sVar2 = strlen(local_8);
          iVar1 = (int)sVar2;
          local_8[iVar1 + -3] = 'p';
          local_8[iVar1 + -2] = 'i';
          local_8[iVar1 + -1] = 'x';
        }
      }
    }
  }
  return local_8;
}

Assistant:

static char *same_path (

char	*pixname,	/* IRAF pixel file pathname */
const char	*hdrname)	/* IRAF image header file pathname */

{
    int len;
    char *newpixname;

/*  WDP - 10/16/2007 - increased allocation to avoid possible overflow */
/*    newpixname = (char *) calloc (SZ_IM2PIXFILE, sizeof (char)); */

    newpixname = (char *) calloc (2*SZ_IM2PIXFILE+1, sizeof (char));
    if (newpixname == NULL) {
            ffpmsg("iraffits same_path: Cannot alloc memory for newpixname");
	    return (NULL);
	}

    /* Pixel file is in same directory as header */
    if (strncmp(pixname, "HDR$", 4) == 0 ) {
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);

	/* find the end of the pathname */
	len = strlen (newpixname);
#ifndef VMS
	while( (len > 0) && (newpixname[len-1] != '/') )
#else
	while( (len > 0) && (newpixname[len-1] != ']') && (newpixname[len-1] != ':') )
#endif
	    len--;

	/* add name */
	newpixname[len] = '\0';
	(void)strncat (newpixname, &pixname[4], SZ_IM2PIXFILE);
	}

    /* Bare pixel file with no path is assumed to be same as HDR$filename */
    else if (strchr (pixname, '/') == NULL && strchr (pixname, '$') == NULL) {
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);

	/* find the end of the pathname */
	len = strlen (newpixname);
#ifndef VMS
	while( (len > 0) && (newpixname[len-1] != '/') )
#else
	while( (len > 0) && (newpixname[len-1] != ']') && (newpixname[len-1] != ':') )
#endif
	    len--;

	/* add name */
	newpixname[len] = '\0';
	(void)strncat (newpixname, pixname, SZ_IM2PIXFILE);
	}

    /* Pixel file has same name as header file, but with .pix extension */
    else if (strncmp (pixname, "HDR", 3) == 0) {

	/* load entire header name string into name buffer */
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);
	len = strlen (newpixname);
	newpixname[len-3] = 'p';
	newpixname[len-2] = 'i';
	newpixname[len-1] = 'x';
	}

    return (newpixname);
}